

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_view_suite.cpp
# Opt level: O2

void push_suite::push_increasing_predicate(void)

{
  array<int,_4UL> array;
  array<int,_4UL> expect;
  int local_58 [2];
  priority_view<int,_18446744073709551615UL,_std::greater<int>_> span;
  
  span.member.span.member.head = array._M_elems;
  span.member.last = array._M_elems;
  array._M_elems[0] = 0;
  array._M_elems[1] = 0;
  array._M_elems[2] = 0;
  array._M_elems[3] = 0;
  span.member.span.member.tail = expect._M_elems;
  vista::priority_view<int,_18446744073709551615UL,_std::greater<int>_>::push(&span,0xb);
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,0x184,"void push_suite::push_increasing_predicate()",array._M_elems,expect._M_elems,
             expect._M_elems,local_58);
  vista::priority_view<int,_18446744073709551615UL,_std::greater<int>_>::push(&span,0x16);
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,0x18a,"void push_suite::push_increasing_predicate()",array._M_elems,expect._M_elems,
             expect._M_elems,local_58);
  vista::priority_view<int,_18446744073709551615UL,_std::greater<int>_>::push(&span,0x21);
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,400,"void push_suite::push_increasing_predicate()",array._M_elems,expect._M_elems,
             expect._M_elems,local_58);
  vista::priority_view<int,_18446744073709551615UL,_std::greater<int>_>::push(&span,0x2c);
  expect._M_elems[0] = 0xb;
  expect._M_elems[1] = 0x16;
  expect._M_elems[2] = 0x21;
  expect._M_elems[3] = 0x2c;
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,0x196,"void push_suite::push_increasing_predicate()",array._M_elems,expect._M_elems,
             expect._M_elems,local_58);
  return;
}

Assistant:

void push_increasing_predicate()
{
    std::array<int, 4> array = {};
    priority_view<int, dynamic_extent, std::greater<int>> span(array.begin(), array.end());
    span.push(11);
    {
        std::array<int, 4> expect = { 11, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(array.begin(), array.end(),
                          expect.begin(), expect.end());
    }
    span.push(22);
    {
        std::array<int, 4> expect = { 11, 22, 0, 0 };
        BOOST_TEST_ALL_EQ(array.begin(), array.end(),
                          expect.begin(), expect.end());
    }
    span.push(33);
    {
        std::array<int, 4> expect = { 11, 22, 33, 0 };
        BOOST_TEST_ALL_EQ(array.begin(), array.end(),
                          expect.begin(), expect.end());
    }
    span.push(44);
    {
        std::array<int, 4> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(array.begin(), array.end(),
                          expect.begin(), expect.end());
    }
}